

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::StatusErrorListener::MissingField
          (StatusErrorListener *this,LocationTrackerInterface *loc,StringPiece missing_name)

{
  StringPiece error_message;
  LocationTrackerInterface *loc_00;
  AlphaNum *in_R8;
  AlphaNum local_140;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  AlphaNum local_e0;
  string local_b0;
  Status local_90;
  string local_68;
  char *local_48;
  size_t local_40;
  char local_38 [16];
  
  loc_00 = (LocationTrackerInterface *)missing_name.ptr_;
  (anonymous_namespace)::StatusErrorListener::GetLocString_abi_cxx11_(&local_b0,loc,loc_00);
  local_110 = local_b0._M_dataplus._M_p._0_4_;
  uStack_10c = local_b0._M_dataplus._M_p._4_4_;
  uStack_108 = (undefined4)local_b0._M_string_length;
  uStack_104 = local_b0._M_string_length._4_4_;
  local_e0.piece_data_ = ": missing field ";
  local_e0.piece_size_ = 0x10;
  local_48 = local_38;
  if (loc_00 == (LocationTrackerInterface *)0x0) {
    local_40 = 0;
    local_38[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,loc_00,
               (long)&loc_00->_vptr_LocationTrackerInterface + missing_name.length_);
  }
  local_140.piece_data_ = local_48;
  local_140.piece_size_ = local_40;
  StrCat_abi_cxx11_(&local_68,(protobuf *)&local_110,&local_e0,&local_140,in_R8);
  error_message.length_ = local_68._M_string_length;
  error_message.ptr_ = local_68._M_dataplus._M_p;
  if ((long)local_68._M_string_length < 0) {
    StringPiece::LogFatalSizeTooBig(local_68._M_string_length,"size_t to int conversion");
  }
  Status::Status(&local_90,INVALID_ARGUMENT,error_message);
  Status::operator=(&this->status_,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.error_message_._M_dataplus._M_p != &local_90.error_message_.field_2) {
    operator_delete(local_90.error_message_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_) !=
      &local_b0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_));
  }
  return;
}

Assistant:

void MissingField(const converter::LocationTrackerInterface& loc,
                    StringPiece missing_name) override {
    status_ = util::Status(util::error::INVALID_ARGUMENT,
                             StrCat(GetLocString(loc), ": missing field ",
                                          std::string(missing_name)));
  }